

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-utils.h
# Opt level: O2

void wasm::MemoryUtils::ensureExists(Module *wasm)

{
  Name name;
  Name local_30;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> local_20;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  if (*(long *)(wasm + 0x78) == *(long *)(wasm + 0x80)) {
    Name::Name(&local_30,"0");
    name.super_IString.str._M_str = (char *)local_30.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_20;
    Builder::makeMemory(name,(Address)local_30.super_IString.str._M_str,(Address)0x0,false,(Type)0x0
                       );
    *(undefined8 *)
     ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = 1;
    *(undefined8 *)
     ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = 1;
    ::wasm::Module::addMemory((unique_ptr *)wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_20);
  }
  return;
}

Assistant:

inline void ensureExists(Module* wasm) {
  if (wasm->memories.empty()) {
    auto memory = Builder::makeMemory("0");
    memory->initial = memory->max = 1;
    wasm->addMemory(std::move(memory));
  }
}